

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_pppp_flags(DisasContext_conflict1 *s,arg_rprr_s *a,GVecGen4_conflict1 *gvec_op)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint oprsz;
  uint32_t dofs_00;
  uint32_t aofs;
  uint32_t bofs;
  uint32_t aofs_00;
  TCGv_i64 arg1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  uint32_t local_6c;
  int tofs;
  TCGv_i64 pg;
  TCGv_i64 pm;
  TCGv_i64 pn;
  TCGv_i64 pd;
  int gofs;
  int mofs;
  int nofs;
  int dofs;
  uint psz;
  TCGContext_conflict1 *tcg_ctx;
  GVecGen4_conflict1 *gvec_op_local;
  arg_rprr_s *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = pred_gvec_reg_size(s);
    dofs_00 = pred_full_reg_offset(s,a->rd);
    aofs = pred_full_reg_offset(s,a->rn);
    bofs = pred_full_reg_offset(s,a->rm);
    aofs_00 = pred_full_reg_offset(s,a->pg);
    if (oprsz == 8) {
      arg1 = tcg_temp_new_i64(tcg_ctx_00);
      ret = tcg_temp_new_i64(tcg_ctx_00);
      ret_00 = tcg_temp_new_i64(tcg_ctx_00);
      ret_01 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_ld_i64_aarch64(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,(long)(int)aofs);
      tcg_gen_ld_i64_aarch64(tcg_ctx_00,ret_00,tcg_ctx_00->cpu_env,(long)(int)bofs);
      tcg_gen_ld_i64_aarch64(tcg_ctx_00,ret_01,tcg_ctx_00->cpu_env,(long)(int)aofs_00);
      (*gvec_op->fni8)(tcg_ctx_00,arg1,ret,ret_00,ret_01);
      tcg_gen_st_i64_aarch64(tcg_ctx_00,arg1,tcg_ctx_00->cpu_env,(long)(int)dofs_00);
      do_predtest1(tcg_ctx_00,arg1,ret_01);
      tcg_temp_free_i64(tcg_ctx_00,arg1);
      tcg_temp_free_i64(tcg_ctx_00,ret);
      tcg_temp_free_i64(tcg_ctx_00,ret_00);
      tcg_temp_free_i64(tcg_ctx_00,ret_01);
    }
    else {
      local_6c = aofs_00;
      if (a->rd == a->pg) {
        local_6c = 0x2e30;
        tcg_gen_gvec_mov_aarch64(tcg_ctx_00,0,0x2e30,aofs_00,oprsz,oprsz);
      }
      tcg_gen_gvec_4_aarch64(tcg_ctx_00,dofs_00,aofs,bofs,aofs_00,oprsz,oprsz,gvec_op);
      do_predtest(s,dofs_00,local_6c,oprsz >> 3);
    }
  }
  return true;
}

Assistant:

static bool do_pppp_flags(DisasContext *s, arg_rprr_s *a,
                          const GVecGen4 *gvec_op)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned psz = pred_gvec_reg_size(s);
    int dofs = pred_full_reg_offset(s, a->rd);
    int nofs = pred_full_reg_offset(s, a->rn);
    int mofs = pred_full_reg_offset(s, a->rm);
    int gofs = pred_full_reg_offset(s, a->pg);

    if (psz == 8) {
        /* Do the operation and the flags generation in temps.  */
        TCGv_i64 pd = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pn = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pm = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pg = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_ld_i64(tcg_ctx, pn, tcg_ctx->cpu_env, nofs);
        tcg_gen_ld_i64(tcg_ctx, pm, tcg_ctx->cpu_env, mofs);
        tcg_gen_ld_i64(tcg_ctx, pg, tcg_ctx->cpu_env, gofs);

        gvec_op->fni8(tcg_ctx, pd, pn, pm, pg);
        tcg_gen_st_i64(tcg_ctx, pd, tcg_ctx->cpu_env, dofs);

        do_predtest1(tcg_ctx, pd, pg);

        tcg_temp_free_i64(tcg_ctx, pd);
        tcg_temp_free_i64(tcg_ctx, pn);
        tcg_temp_free_i64(tcg_ctx, pm);
        tcg_temp_free_i64(tcg_ctx, pg);
    } else {
        /* The operation and flags generation is large.  The computation
         * of the flags depends on the original contents of the guarding
         * predicate.  If the destination overwrites the guarding predicate,
         * then the easiest way to get this right is to save a copy.
          */
        int tofs = gofs;
        if (a->rd == a->pg) {
            tofs = offsetof(CPUARMState, vfp.preg_tmp);
            tcg_gen_gvec_mov(tcg_ctx, 0, tofs, gofs, psz, psz);
        }

        tcg_gen_gvec_4(tcg_ctx, dofs, nofs, mofs, gofs, psz, psz, gvec_op);
        do_predtest(s, dofs, tofs, psz / 8);
    }
    return true;
}